

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O3

bool ppmb_read(string *input_name,int *xsize,int *ysize,int *maxrgb,uchar **r,uchar **g,uchar **b)

{
  int xsize_00;
  int ysize_00;
  bool bVar1;
  ostream *poVar2;
  uchar *puVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  ifstream input;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)(input_name->_M_dataplus)._M_p);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    bVar1 = ppmb_read_header((ifstream *)local_238,xsize,ysize,maxrgb);
    if (bVar1) {
      poVar2 = (ostream *)&std::cout;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"PPMB_READ - Fatal error!\n",0x19);
      lVar6 = 0x1b;
      pcVar4 = "  PPMB_READ_HEADER failed.\n";
    }
    else {
      xsize_00 = *xsize;
      ysize_00 = *ysize;
      uVar5 = (ulong)(ysize_00 * xsize_00);
      puVar3 = (uchar *)operator_new__(uVar5);
      *r = puVar3;
      puVar3 = (uchar *)operator_new__(uVar5);
      *g = puVar3;
      puVar3 = (uchar *)operator_new__(uVar5);
      *b = puVar3;
      bVar1 = ppmb_read_data((ifstream *)local_238,xsize_00,ysize_00,*r,*g,puVar3);
      if (!bVar1) {
        std::ifstream::close();
        bVar1 = false;
        goto LAB_00104d24;
      }
      poVar2 = (ostream *)&std::cout;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      lVar6 = 0x19;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"PPMB_READ - Fatal error!\n",0x19);
      pcVar4 = "  PPMB_READ_DATA failed.\n";
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PPMB_READ - Fatal error!\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Cannot open the input file \"",0x1e);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(input_name->_M_dataplus)._M_p,
                        input_name->_M_string_length);
    lVar6 = 3;
    pcVar4 = "\".\n";
  }
  bVar1 = true;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar6);
LAB_00104d24:
  std::ifstream::~ifstream(local_238);
  return bVar1;
}

Assistant:

bool ppmb_read ( string input_name, int &xsize, int &ysize, int &maxrgb,
  unsigned char **r, unsigned char **g, unsigned char **b )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_READ reads the header and data from a binary portable pixel map file.
//
//  Discussion:
//
//    Thanks to Jonas Schwertfeger for pointing out that, especially on 
//    Microsoft Windows systems, a binary file needs to be opened as a binary 
//    file!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
// 
//    22 July 2011
// 
//  Author:
// 
//    John Burkardt
//
//  Parameters:
//
//    Input, string INPUT_NAME, the name of the file containing the binary
//    portable pixel map data.
//
//    Output, int &XSIZE, &YSIZE, the number of rows and columns of data.
//
//    Output, int &MAXRGB, the maximum RGB value.
//
//    Output, unsigned char **R, **G, **B, the arrays of XSIZE by YSIZE 
//    data values.
//
//    Output, bool PPMB_READ, is true if there was an error.
//
{
  bool error;
  ifstream input;

  input.open ( input_name.c_str ( ), ios::binary );

  if ( !input )
  {
    cout << "\n";
    cout << "PPMB_READ - Fatal error!\n";
    cout << "  Cannot open the input file \"" << input_name << "\".\n";
    return true;
  }
//
//  Read the header.
//
  error = ppmb_read_header ( input, xsize, ysize, maxrgb );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_READ - Fatal error!\n";
    cout << "  PPMB_READ_HEADER failed.\n";
    return true;
  }
//
//  Allocate storage for the data.
//
  *r = new unsigned char[xsize * ysize];
  *g = new unsigned char[xsize * ysize];
  *b = new unsigned char[xsize * ysize];
//
//  Read the data.
//
  error = ppmb_read_data ( input, xsize, ysize, *r, *g, *b );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_READ - Fatal error!\n";
    cout << "  PPMB_READ_DATA failed.\n";
    return true;
  }
//
//  Close the file.
//
  input.close ( );

  return false;
}